

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_chain.cpp
# Opt level: O0

void __thiscall Sample::Sample(Sample *this,char *filename)

{
  undefined8 uVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  allocator<char> local_41;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  std::__cxx11::string::string((string *)(in_RDI + 1));
  uVar1 = al_load_sample(in_RSI);
  *in_RDI = uVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  basename(&stack0xffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

Sample::Sample(char const *filename)
{
   spl = al_load_sample(filename);
   basename(filename, this->filename);
}